

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::match_positions
          (Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *this)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_RSI;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000008;
  Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *in_stack_00000010;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000028;
  Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *in_stack_00000030;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *posns;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *in_stack_ffffffffffffffe0;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x14709f);
  if ((int)in_RSI._M_current[0xc] == 0) {
    get_match_positions_sorted_no_prefix
              (in_stack_ffffffffffffffe0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  else {
    get_match_positions_component_prefix_dirpath(in_stack_00000030,in_stack_00000028);
    if ((int)in_RSI._M_current[0xc] == 2) {
      get_match_positions_basename_word_prefix(in_stack_00000010,in_stack_00000008);
    }
    else {
      get_match_positions_basename_non_word_prefix
                (in_stack_ffffffffffffffe0,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffffa8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffffa8);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (in_RSI,in_RDI);
  }
  return (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI._M_current;
}

Assistant:

std::vector<std::size_t> match_positions() const final {
    std::vector<std::size_t> posns;
    if (prefix_level_ == PrefixLevel::NONE) {
      get_match_positions_sorted_no_prefix(posns);
      return posns;
    }
    get_match_positions_component_prefix_dirpath(posns);
    if (prefix_level_ == PrefixLevel::BASENAME_WORD) {
      get_match_positions_basename_word_prefix(posns);
    } else {
      get_match_positions_basename_non_word_prefix(posns);
    }
    std::sort(posns.begin(), posns.end());
    return posns;
  }